

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.c
# Opt level: O3

sexp simplify(sexp ctx,sexp ast,sexp init_substs,sexp lambda)

{
  sexp psVar1;
  sexp psVar2;
  sexp psVar3;
  sexp psVar4;
  sexp psVar5;
  sexp psVar6;
  sexp ls1;
  sexp app;
  sexp ctx2;
  sexp local_a8;
  sexp local_a0;
  sexp local_98;
  sexp local_90;
  sexp local_88;
  sexp_gc_var_t local_80;
  sexp_gc_var_t local_70;
  sexp_gc_var_t local_60;
  sexp_gc_var_t local_50;
  sexp_gc_var_t local_40;
  
  local_98 = (sexp)&DAT_0000043e;
  local_a8 = (sexp)&DAT_0000043e;
  local_88 = (sexp)0x43e;
  if (((ulong)ast & 3) != 0) {
    return ast;
  }
  local_80.var = &local_a0;
  local_40.next = &local_80;
  local_80.next = (ctx->value).context.saves;
  local_40.var = &local_90;
  local_50.next = &local_40;
  local_50.var = &local_98;
  local_60.next = &local_50;
  local_60.var = &local_a8;
  local_70.next = &local_60;
  local_70.var = &local_88;
  (ctx->value).context.saves = &local_70;
  local_a0 = ast;
  local_90 = init_substs;
  switch(ast->tag) {
  case 0x1c:
    psVar1 = (ast->value).type.slots;
    lambda = ast;
LAB_0012ce37:
    psVar1 = simplify(ctx,psVar1,local_90,lambda);
    (local_a0->value).type.slots = psVar1;
    ast = local_a0;
    break;
  case 0x1d:
    local_98 = simplify(ctx,(ast->value).type.name,init_substs,lambda);
    psVar1 = local_98;
    if (((ulong)local_98 & 3) == 0) {
      if (local_98->tag != 0x22) {
        (local_a0->value).type.name = local_98;
        psVar1 = simplify(ctx,(local_a0->value).type.cpl,local_90,lambda);
        (local_a0->value).type.cpl = psVar1;
        psVar1 = (local_a0->value).type.slots;
        goto LAB_0012ce37;
      }
      psVar1 = (local_98->value).type.name;
    }
    local_a0 = *(sexp *)((long)&local_a0->value + (ulong)(psVar1 == (sexp)&DAT_0000003e) * 8 + 8);
    ast = simplify(ctx,local_a0,local_90,lambda);
    break;
  case 0x1e:
    if (((ulong)init_substs & 3) == 0) {
      do {
        if (init_substs->tag != 6) break;
        psVar1 = (init_substs->value).type.name;
        if (((psVar1->value).type.name == (ast->value).type.name) &&
           (psVar1 = (psVar1->value).type.cpl,
           (psVar1->value).type.name == (((ast->value).type.cpl)->value).type.cpl)) {
          ast = (psVar1->value).type.cpl;
          break;
        }
        init_substs = (init_substs->value).type.cpl;
      } while (((ulong)init_substs & 3) == 0);
    }
    break;
  case 0x1f:
    psVar1 = simplify(ctx,(ast->value).type.cpl,init_substs,lambda);
    (local_a0->value).type.cpl = psVar1;
    ast = local_a0;
    break;
  case 0x20:
    break;
  case 0x21:
    local_a8 = (sexp)&DAT_0000023e;
    psVar1 = (ast->value).type.name;
    if ((((ulong)psVar1 & 3) == 0) && (psVar1->tag == 6)) {
      do {
        local_98 = simplify(ctx,(psVar1->value).type.name,local_90,lambda);
        psVar5 = (psVar1->value).type.cpl;
        if (((((ulong)psVar5 & 3) != 0) || (psVar5->tag != 6)) ||
           ((((ulong)local_98 & 3) == 0 &&
            ((0x22 < (ulong)local_98->tag ||
             ((0x450000000U >> ((ulong)local_98->tag & 0x3f) & 1) == 0)))))) {
          sexp_push_op(ctx,&local_a8,local_98);
          psVar5 = (psVar1->value).type.cpl;
          if (((ulong)psVar5 & 3) != 0) break;
        }
        psVar1 = psVar5;
      } while (psVar5->tag == 6);
    }
    if (((((ulong)local_a8 & 3) == 0) && (local_a8->tag == 6)) &&
       ((local_a8->value).type.cpl == (sexp)0x23e)) {
      ast = (sexp)(local_a8->value).flonum;
    }
    else {
      psVar1 = sexp_nreverse_op(ctx,(sexp)0x0,1,local_a8);
      (local_a0->value).type.name = psVar1;
      ast = local_a0;
    }
    break;
  default:
    if (ast->tag == 6) {
      psVar1 = (ast->value).type.name;
      if ((((ulong)psVar1 & 3) != 0) || (psVar1->tag != 0x1c)) {
        psVar1 = simplify(ctx,psVar1,init_substs,lambda);
        local_98 = psVar1;
      }
      local_a8 = sexp_cons_op(ctx,(sexp)0x0,2,psVar1,(sexp)&DAT_0000023e);
      (local_a8->value).type.slots = (local_a0->value).type.slots;
      psVar1 = (local_a0->value).type.cpl;
      if ((((ulong)psVar1 & 3) == 0) && (psVar1->tag == 6)) {
        do {
          local_98 = simplify(ctx,(psVar1->value).type.name,local_90,lambda);
          sexp_push_op(ctx,&local_a8,local_98);
          if ((((ulong)local_a8 & 3) == 0) && (local_a8->tag == 6)) {
            (local_a8->value).type.slots = (psVar1->value).type.slots;
          }
          psVar1 = (psVar1->value).type.cpl;
        } while ((((ulong)psVar1 & 3) == 0) && (psVar1->tag == 6));
      }
      ast = sexp_nreverse_op(ctx,(sexp)0x0,1,local_a8);
      psVar1 = (ast->value).type.name;
      if (((ulong)psVar1 & 3) == 0) {
        local_a8 = ast;
        if (psVar1->tag == 0x1b) {
          if ((psVar1->value).flonum_bits[0x58] == '\x04') {
            for (psVar1 = (ast->value).type.cpl; (((ulong)psVar1 & 3) == 0 && (psVar1->tag == 6));
                psVar1 = (psVar1->value).type.cpl) {
              psVar5 = (psVar1->value).type.name;
              if ((((ulong)psVar5 & 3) == 0) && (psVar5->tag != 0x22))
              goto switchD_0012ce2b_caseD_20;
            }
            local_88 = sexp_make_eval_context(ctx,(sexp)0x0,(ctx->value).type.cpl,0,0);
            sexp_generate(local_88,(sexp_conflict)0x0,(sexp_conflict)0x0,(sexp_conflict)0x0,local_a8
                         );
            local_a0 = sexp_complete_bytecode(local_88);
            if ((((ulong)local_a0 & 3) != 0) || (ast = local_a8, local_a0->tag != 0x13)) {
              local_98 = sexp_make_vector_op(local_88,(sexp)0x0,2,(sexp)0x0,(sexp)&DAT_0000043e);
              local_98 = sexp_make_procedure_op
                                   (local_88,(sexp)0x0,4,(sexp)&DAT_00000001,(sexp)&DAT_00000001,
                                    local_a0,local_98);
              if (((((ulong)local_98 & 3) != 0) || (ast = local_a8, local_98->tag != 0x13)) &&
                 ((local_98 = sexp_apply_no_err_handler
                                        (local_88,local_98,(sexp_conflict)&DAT_0000023e),
                  ((ulong)local_98 & 3) != 0 || (ast = local_a8, local_98->tag != 0x13)))) {
                ast = sexp_make_lit(local_88,local_98);
              }
            }
          }
        }
        else if ((lambda != (sexp)0x0) && (psVar1->tag == 0x1c)) {
          psVar5 = (psVar1->value).type.cpl;
          psVar1 = (psVar1->value).type.dl;
          ls1 = (ast->value).type.cpl;
          psVar2 = sexp_length_op(ctx,(sexp)0x0,1,psVar5);
          psVar3 = sexp_length_op(ctx,(sexp)0x0,1,ls1);
          if (psVar2 == psVar3) {
            if (((ulong)ls1 & 3) == 0) {
              psVar2 = (sexp)0x0;
              do {
                if (ls1->tag != 6) break;
                psVar4 = sexp_memq_op(ctx,(sexp)0x0,2,(psVar5->value).type.name,psVar1);
                psVar3 = psVar5;
                psVar6 = ls1;
                if ((psVar4 == (sexp)&DAT_0000003e) &&
                   ((psVar4 = (ls1->value).type.name, ((ulong)psVar4 & 3) != 0 ||
                    (psVar4->tag == 0x22)))) {
                  local_98 = sexp_cons_op(ctx,(sexp)0x0,2,(local_a8->value).type.name,psVar4);
                  local_98 = sexp_cons_op(ctx,(sexp)0x0,2,(psVar5->value).type.name,local_98);
                  sexp_push_op(ctx,&local_90,local_98);
                  (ast->value).type.cpl = (ls1->value).type.cpl;
                  psVar3 = psVar2;
                  if (psVar2 == (sexp)0x0) {
                    psVar3 = (local_a8->value).type.name;
                    psVar2 = (sexp)0x0;
                  }
                  (psVar3->value).type.cpl = (psVar5->value).type.cpl;
                  psVar3 = psVar2;
                  psVar6 = ast;
                }
                ls1 = (ls1->value).type.cpl;
                psVar5 = (psVar5->value).type.cpl;
                psVar2 = psVar3;
                ast = psVar6;
              } while (((ulong)ls1 & 3) == 0);
            }
            psVar1 = (local_a8->value).type.name;
          }
          else {
            psVar1 = (local_a8->value).type.name;
            ast = local_a8;
            if ((((ulong)psVar1 & 3) != 0) || (psVar1->tag != 0x1c)) break;
          }
          psVar1 = simplify(ctx,(psVar1->value).type.slots,local_90,psVar1);
          (((local_a8->value).type.name)->value).type.slots = psVar1;
          ast = local_a8;
        }
      }
    }
  }
switchD_0012ce2b_caseD_20:
  (ctx->value).context.saves = local_80.next;
  return ast;
}

Assistant:

static sexp simplify (sexp ctx, sexp ast, sexp init_substs, sexp lambda) {
  int check;
  sexp ls1, ls2, p1, p2, sv;
  sexp_gc_var5(res, substs, tmp, app, ctx2);
  if (!sexp_pointerp(ast))
    return ast;
  sexp_gc_preserve5(ctx, res, substs, tmp, app, ctx2);
  res = ast;                    /* return the ast as-is by default */
  substs = init_substs;

  switch (sexp_pointer_tag(res)) {

  case SEXP_PAIR:
    /* don't simplify the operator if it's a lambda because we
       simplify that as a special case below, with the appropriate
       substs list */
    app = sexp_list1(ctx, sexp_lambdap(sexp_car(res)) ? sexp_car(res)
                     : (tmp=simplify(ctx, sexp_car(res), substs, lambda)));
    sexp_pair_source(app) = sexp_pair_source(res);
    for (ls1=sexp_cdr(res); sexp_pairp(ls1); ls1=sexp_cdr(ls1)) {
      sexp_push(ctx, app, tmp=simplify(ctx, sexp_car(ls1), substs, lambda));
      if (sexp_pairp(app)) sexp_pair_source(app) = sexp_pair_source(ls1);
    }
    app = sexp_nreverse(ctx, app);
    /* app now holds a copy of the list, and is the default result
       (res = app below) if we don't replace it with a simplification */
    if (sexp_opcodep(sexp_car(app))) {
      /* opcode app - right now we just constant fold arithmetic */
      if (sexp_opcode_class(sexp_car(app)) == SEXP_OPC_ARITHMETIC) {
        for (check=1, ls1=sexp_cdr(app); sexp_pairp(ls1); ls1=sexp_cdr(ls1)) {
          if (sexp_pointerp(sexp_car(ls1)) && ! sexp_litp(sexp_car(ls1))) {
            check = 0;
            break;
          }
        }
        if (check) {
          ctx2 = sexp_make_eval_context(ctx, NULL, sexp_context_env(ctx), 0, 0);
          sexp_generate(ctx2, 0, 0, 0, app);
          res = sexp_complete_bytecode(ctx2);
          if (! sexp_exceptionp(res)) {
            tmp = sexp_make_vector(ctx2, 0, SEXP_VOID);
            tmp = sexp_make_procedure(ctx2, SEXP_ZERO, SEXP_ZERO, res, tmp);
            if (! sexp_exceptionp(tmp)) {
              tmp = sexp_apply_no_err_handler(ctx2, tmp, SEXP_NULL);
              if (! sexp_exceptionp(tmp))
                app = sexp_make_lit(ctx2, tmp);
            }
          }
        }
      }
    } else if (lambda && sexp_lambdap(sexp_car(app))) { /* let */
      p1 = NULL;
      p2 = sexp_lambda_params(sexp_car(app));
      ls1 = app;
      ls2 = sexp_cdr(app);
      sv = sexp_lambda_sv(sexp_car(app));
      /* inline constants and immutable references */
      if (sexp_length(ctx, p2) == sexp_length(ctx, ls2)) {
        for ( ; sexp_pairp(ls2); ls2=sexp_cdr(ls2), p2=sexp_cdr(p2)) {
          if (sexp_not(sexp_memq(ctx, sexp_car(p2), sv))
              && (! sexp_pointerp(sexp_car(ls2)) || sexp_litp(sexp_car(ls2))
                  /* disable inline references for now */
                  || (0 && sexp_refp(sexp_car(ls2))
                      && sexp_lambdap(sexp_ref_loc(sexp_car(ls2)))
                      && sexp_not(sexp_memq(ctx, sexp_ref_name(sexp_car(ls2)),
                                            sexp_lambda_sv(sexp_ref_loc(sexp_car(ls2)))))))) {
            tmp = sexp_cons(ctx, sexp_car(app), sexp_car(ls2));
            tmp = sexp_cons(ctx, sexp_car(p2), tmp);
            sexp_push(ctx, substs, tmp);
            sexp_cdr(ls1) = sexp_cdr(ls2);
            if (p1)
              sexp_cdr(p1) = sexp_cdr(p2);
            else
              sexp_lambda_params(sexp_car(app)) = sexp_cdr(p2);
          } else {
            p1 = p2;
            ls1 = ls2;
          }
        }
        sexp_lambda_body(sexp_car(app))
          = simplify(ctx, sexp_lambda_body(sexp_car(app)), substs, sexp_car(app));
        /* TODO: Revisit this - it causes GC problems in rare cases. */
        /* if (sexp_nullp(sexp_cdr(app)) */
        /*     && sexp_nullp(sexp_lambda_params(sexp_car(app))) */
        /*     && sexp_nullp(sexp_lambda_defs(sexp_car(app)))) */
        /*   app = sexp_lambda_body(sexp_car(app)); */
      } else if (sexp_lambdap(sexp_car(app))) {
        sexp_lambda_body(sexp_car(app))
          = simplify(ctx, sexp_lambda_body(sexp_car(app)), substs, sexp_car(app));
      }
    }
    res = app;
    break;

  case SEXP_LAMBDA:
    sexp_lambda_body(res) = simplify(ctx, sexp_lambda_body(res), substs, res);
    break;

  case SEXP_CND:
    tmp = simplify(ctx, sexp_cnd_test(res), substs, lambda);
    if (sexp_litp(tmp) || ! sexp_pointerp(tmp)) {
      res = sexp_not((sexp_litp(tmp) ? sexp_lit_value(tmp) : tmp))
        ? sexp_cnd_fail(res) : sexp_cnd_pass(res);
      res = simplify(ctx, res, substs, lambda);
    } else {
      sexp_cnd_test(res) = tmp;
      simplify_it(sexp_cnd_pass(res));
      simplify_it(sexp_cnd_fail(res));
    }
    break;

  case SEXP_REF:
    tmp = sexp_ref_name(res);
    for (ls1=substs; sexp_pairp(ls1); ls1=sexp_cdr(ls1))
      if ((sexp_caar(ls1) == tmp) && (sexp_cadar(ls1) == sexp_ref_loc(res))) {
        res = sexp_cddar(ls1);
        break;
      }
    break;

  case SEXP_SET:
    simplify_it(sexp_set_value(res));
    break;

  case SEXP_SEQ:
    app = SEXP_NULL;
    for (ls2=sexp_seq_ls(res); sexp_pairp(ls2); ls2=sexp_cdr(ls2)) {
      tmp = simplify(ctx, sexp_car(ls2), substs, lambda);
      if (! (sexp_pairp(sexp_cdr(ls2))
             && (sexp_litp(tmp) || ! sexp_pointerp(tmp) || sexp_refp(tmp)
                 || sexp_lambdap(tmp))))
        sexp_push(ctx, app, tmp);
    }
    if (sexp_pairp(app) && sexp_nullp(sexp_cdr(app)))
      res = sexp_car(app);
    else
      sexp_seq_ls(res) = sexp_nreverse(ctx, app);
    break;

  }

  sexp_gc_release5(ctx);
  return res;
}